

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadCellIsFlop(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  Scl_Pair_t Pair;
  int iVar1;
  Scl_Item_t *pSVar2;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 0;
    }
    Pair = pSVar2->Key;
    iVar1 = Scl_LibertyCompare(p,Pair,"ff");
    if (iVar1 == 0) break;
    iVar1 = Scl_LibertyCompare(p,Pair,"latch");
    piVar3 = &pSVar2->Next;
    if (iVar1 == 0) {
      return 1;
    }
  }
  return 1;
}

Assistant:

int Scl_LibertyReadCellIsFlop( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "ff") ||
             !Scl_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}